

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O0

void __thiscall
io::
CSVReader<12u,io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>,io::throw_on_overflow,io::no_comment>
::
read_header<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
          (CSVReader<12u,io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>,io::throw_on_overflow,io::no_comment>
           *this,ignore_column ignore_policy,char *cols,char *cols_1,char *cols_2,char *cols_3,
          char *cols_4,char *cols_5,char *cols_6,char *cols_7,char *cols_8,char *cols_9,
          char *cols_10,char *cols_11)

{
  bool bVar1;
  char *line_00;
  header_missing *this_00;
  with_file_name *err;
  char *line;
  allocator local_79;
  string local_78 [32];
  char *local_58;
  char *cols_local_3;
  char *cols_local_2;
  char *cols_local_1;
  char *cols_local;
  CSVReader<12u,io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>,io::throw_on_overflow,io::no_comment>
  *pCStack_30;
  ignore_column ignore_policy_local;
  CSVReader<12U,_io::trim_chars<___,___t_>,_io::no_quote_escape<_,_>,_io::throw_on_overflow,_io::no_comment>
  *this_local;
  
  local_58 = cols_3;
  cols_local_3 = cols_2;
  cols_local_2 = cols_1;
  cols_local_1 = cols;
  cols_local._4_4_ = ignore_policy;
  pCStack_30 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,cols,&local_79);
  set_column_names<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            (this,(string *)local_78,cols_local_2,cols_local_3,local_58,cols_4,cols_5,cols_6,cols_7,
             cols_8,cols_9,cols_10,cols_11);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  do {
    line_00 = LineReader::next_line((LineReader *)this);
    if (line_00 == (char *)0x0) {
      this_00 = (header_missing *)__cxa_allocate_exception();
      memset(this_00,0,0x208);
      error::header_missing::header_missing(this_00);
      __cxa_throw(this_00,&error::header_missing::typeinfo,error::header_missing::~header_missing);
    }
    bVar1 = no_comment::is_comment(line_00);
  } while (bVar1);
  detail::parse_header_line<12u,io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>>
            (line_00,(vector<int,_std::allocator<int>_> *)(this + 0x3b0),(string *)(this + 0x230),
             cols_local._4_4_);
  return;
}

Assistant:

void read_header(ignore_column ignore_policy, ColNames...cols){
                        static_assert(sizeof...(ColNames)>=column_count, "not enough column names specified");
                        static_assert(sizeof...(ColNames)<=column_count, "too many column names specified");
                        try{
                                set_column_names(std::forward<ColNames>(cols)...);

                                char*line;
                                do{
                                        line = in.next_line();
                                        if(!line)
                                                throw error::header_missing();
                                }while(comment_policy::is_comment(line));

                                detail::parse_header_line
                                        <column_count, trim_policy, quote_policy>
                                        (line, col_order, column_names, ignore_policy);
                        }catch(error::with_file_name&err){
                                err.set_file_name(in.get_truncated_file_name());
                                throw;
                        }
                }